

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O0

ssize_t __thiscall
ritobin::io::impl_binary_read::BinaryReader::read
          (BinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  char *__s;
  bool bVar1;
  undefined7 extraout_var;
  ulong __n;
  undefined4 in_register_00000034;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  unsigned_short local_22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_20;
  uint16_t size;
  string *value_local;
  BinaryReader *this_local;
  
  pbStack_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000034,__fd);
  local_22 = 0;
  value_local = (string *)this;
  bVar1 = read<unsigned_short>(this,&local_22);
  if (bVar1) {
    if ((BinaryReader *)this->cap_ < (BinaryReader *)(this->cur_ + (int)(uint)local_22)) {
      this_local._7_1_ = 0;
      this = (BinaryReader *)(this->cur_ + (int)(uint)local_22);
    }
    else {
      __s = this->cur_;
      __n = (ulong)local_22;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,__s,__n,&local_49);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (pbStack_20,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      this->cur_ = this->cur_ + (int)(uint)local_22;
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
    this = (BinaryReader *)CONCAT71(extraout_var,bVar1);
  }
  return CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool read(std::string& value) noexcept {
            uint16_t size = {};
            if (!read(size)) {
                return false;
            }
            if (cur_ + size > cap_) {
                return false;
            }
            value = { cur_, size };
            cur_ += size;
            return true;
        }